

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool __thiscall basist::ktx2_transcoder::start_transcoding(ktx2_transcoder *this)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  
  if (this->m_pData == (uint8_t *)0x0) {
    return false;
  }
  iVar1 = *(int *)(this->m_header).m_supercompression_scheme.m_bytes;
  if (iVar1 == 2) {
LAB_00150ee9:
    bVar2 = false;
  }
  else {
    if (iVar1 == 1) {
      if ((this->m_etc1s_transcoder).m_local_endpoints.m_size != 0) {
        return true;
      }
      bVar2 = decompress_etc1s_global_data(this);
      if (!bVar2) goto LAB_00150ee9;
      if ((((this->m_is_video == false) && (*(int *)(this->m_header).m_face_count.m_bytes == 1)) &&
          (1 < *(uint *)(this->m_header).m_layer_count.m_bytes)) &&
         (uVar3 = (ulong)(this->m_etc1s_image_descs).m_size, uVar3 != 0)) {
        lVar4 = 0;
        do {
          if (((((this->m_etc1s_image_descs).m_p)->m_image_flags).m_bytes[lVar4] & 2) != 0) {
            this->m_is_video = true;
            break;
          }
          lVar4 = lVar4 + 0x14;
        } while (uVar3 * 0x14 != lVar4);
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ktx2_transcoder::start_transcoding()
	{
		if (!m_pData)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::start_transcoding: Must call init() first\n");
			return false;
		}

		if (m_header.m_supercompression_scheme == KTX2_SS_BASISLZ) 
		{
			// Check if we've already decompressed the ETC1S global data. If so don't unpack it again.
			if (!m_etc1s_transcoder.get_endpoints().empty())
				return true;

			if (!decompress_etc1s_global_data())
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::start_transcoding: decompress_etc1s_global_data() failed\n");
				return false;
			}
			
			if (!m_is_video)
			{
				// See if there are any P-frames. If so it must be a video, even if there wasn't a KTXanimData key.
				// Video cannot be a cubemap, and it must be a texture array.
				if ((m_header.m_face_count == 1) && (m_header.m_layer_count > 1))
				{
					for (uint32_t i = 0; i < m_etc1s_image_descs.size(); i++)
					{
						if (m_etc1s_image_descs[i].m_image_flags & KTX2_IMAGE_IS_P_FRAME)
						{
							m_is_video = true;
							break;
						}
					}
				}
			}
		}
		else if (m_header.m_supercompression_scheme == KTX2_SS_ZSTANDARD)
		{
#if !BASISD_SUPPORT_KTX2_ZSTD
			BASISU_DEVEL_ERROR("ktx2_transcoder::start_transcoding: File uses zstd supercompression, but zstd support was not enabled at compilation time (BASISD_SUPPORT_KTX2_ZSTD == 0)\n");
			return false;
#endif
		}

		return true;
	}